

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O0

QString * __thiscall
RichHdrWrapper::getFieldName(QString *__return_storage_ptr__,RichHdrWrapper *this,size_t fieldId)

{
  size_t sVar1;
  size_t cnt;
  size_t fieldId_local;
  RichHdrWrapper *this_local;
  
  if ((this->richSign == (RICH_SIGNATURE *)0x0) || (this->dansHdr == (RICH_DANS_HEADER *)0x0)) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    sVar1 = this->compIdCounter;
    if (fieldId == 0) {
      QString::QString(__return_storage_ptr__,"DanS ID");
    }
    else if (fieldId - 1 < 3) {
      QString::QString(__return_storage_ptr__,"Checksumed padding");
    }
    else if ((fieldId < 4) || (sVar1 + 3 < fieldId)) {
      if (fieldId == sVar1 + 4) {
        QString::QString(__return_storage_ptr__,"Rich ID");
      }
      else if (fieldId == sVar1 + 5) {
        QString::QString(__return_storage_ptr__,"Checksum");
      }
      else {
        QString::QString(__return_storage_ptr__,"");
      }
    }
    else {
      QString::QString(__return_storage_ptr__,"Comp ID");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString RichHdrWrapper::getFieldName(size_t fieldId)
{
    if (!this->richSign || !this->dansHdr) {
        return "";
    }
    const size_t cnt = this->compIdCounter - 1;

    switch (fieldId) {
         case DANS_ID: return("DanS ID");
         case CPAD0: case CPAD1: case CPAD2:  return ("Checksumed padding");
    }
    if (fieldId >= COMP_ID_1 && fieldId <= COMP_ID_1 + cnt)
    {
        return("Comp ID");
    }
    if (fieldId == RICH_ID + cnt) return("Rich ID");
    if (fieldId == CHECKSUM + cnt) return("Checksum");
    return "";
}